

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O0

const_iterator * __thiscall
compressed_sparse_matrix<filtration_entry_t>::cbegin
          (compressed_sparse_matrix<filtration_entry_t> *this,size_t index)

{
  long in_RDX;
  const_iterator *in_RDI;
  deque<filtration_entry_t,_std::allocator<filtration_entry_t>_> *in_stack_ffffffffffffffa8;
  const_iterator *__x;
  
  if (in_RDX == 0) {
    std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::cbegin
              (in_stack_ffffffffffffffa8);
    __x = in_RDI;
  }
  else {
    __x = in_RDI;
    std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>::cbegin
              (in_stack_ffffffffffffffa8);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
               (size_type)in_stack_ffffffffffffffa8);
    std::operator+(__x,(difference_type)in_RDI);
  }
  return __x;
}

Assistant:

typename std::deque<ValueType>::const_iterator cbegin(size_t index) const {
		assert(index < size());
		return index == 0 ? entries.cbegin() : entries.cbegin() + bounds[index - 1];
	}